

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition-optimizer.hxx
# Opt level: O0

void __thiscall
lineage::heuristics::
PartitionOptimizerBase<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>_>
::applyMerge(PartitionOptimizerBase<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>_>
             *this,size_t partitionIdA,size_t partitionIdB)

{
  bool bVar1;
  reference pvVar2;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  *__lhs;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  *p_Var3;
  PartitionGraph *in_RDX;
  PartitionGraph *in_RSI;
  unsigned_long *in_RDI;
  double dVar4;
  pair<bool,_unsigned_long> pVar5;
  double dLocalBranchingObj;
  double localBranchingObj;
  unsigned_long *v_3;
  iterator __end3_1;
  iterator __begin3_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range3_1;
  unsigned_long *v_2;
  iterator __end4_1;
  iterator __begin4_1;
  value_type *__range4_1;
  unsigned_long *v_1;
  iterator __end4;
  iterator __begin4;
  value_type *__range4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> buffer;
  size_t otherId;
  pair<bool,_unsigned_long> p;
  unsigned_long *w;
  iterator __end3;
  iterator __begin3;
  value_type *__range3;
  unsigned_long *v;
  iterator __end2;
  iterator __begin2;
  value_type *__range2;
  Cost dObj;
  value_type *partitionB;
  value_type *partitionA;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *in_stack_fffffffffffffec8;
  _Node_iterator<unsigned_long,_true,_false> *in_stack_fffffffffffffed0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffee0;
  size_type in_stack_fffffffffffffef8;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_ffffffffffffff00;
  reference in_stack_ffffffffffffff10;
  _Node_iterator_base<unsigned_long,_false> in_stack_ffffffffffffff18;
  _Node_iterator_base<unsigned_long,_false> in_stack_ffffffffffffff20;
  _Node_iterator_base<unsigned_long,_false> local_c8;
  _Node_iterator_base<unsigned_long,_false> in_stack_ffffffffffffff40;
  size_t in_stack_ffffffffffffff48;
  Graph<andres::graph::IdleGraphVisitor<unsigned_long>_> *in_stack_ffffffffffffff50;
  PartitionGraph *local_88;
  _Node_iterator_base<unsigned_long,_false> local_68;
  _Node_iterator_base<unsigned_long,_false> local_60;
  reference local_58;
  reference local_50;
  _Node_iterator_base<unsigned_long,_false> local_48;
  _Node_iterator_base<unsigned_long,_false> local_40;
  reference local_38;
  double local_30;
  reference local_28;
  reference local_20;
  PartitionGraph *partitionId;
  PartitionGraph *this_00;
  
  local_20 = std::
             vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
             ::operator[]((vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                           *)(in_RDI + 0x13),(size_type)in_RSI);
  local_28 = std::
             vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
             ::operator[]((vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                           *)(in_RDI + 0x13),(size_type)in_RDX);
  bVar1 = std::
          unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
          ::empty((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                   *)0x1dcb4e);
  if ((!bVar1) &&
     (bVar1 = std::
              unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
              ::empty((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                       *)0x1dcb5f), !bVar1)) {
    local_30 = 0.0;
    local_38 = local_20;
    local_40._M_cur =
         (__node_type *)
         std::
         unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
         ::begin(in_stack_fffffffffffffec8);
    local_48._M_cur =
         (__node_type *)
         std::
         unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
         ::end(in_stack_fffffffffffffec8);
    local_88 = in_RDX;
    while (bVar1 = std::__detail::operator!=(&local_40,&local_48), bVar1) {
      local_50 = std::__detail::_Node_iterator<unsigned_long,_true,_false>::operator*
                           ((_Node_iterator<unsigned_long,_true,_false> *)0x1dcbdb);
      local_58 = local_28;
      local_60._M_cur =
           (__node_type *)
           std::
           unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
           ::begin(in_stack_fffffffffffffec8);
      local_68._M_cur =
           (__node_type *)
           std::
           unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
           ::end(in_stack_fffffffffffffec8);
      while (bVar1 = std::__detail::operator!=(&local_60,&local_68), bVar1) {
        std::__detail::_Node_iterator<unsigned_long,_true,_false>::operator*
                  ((_Node_iterator<unsigned_long,_true,_false> *)0x1dcc48);
        ProblemGraph::graph(*(ProblemGraph **)in_RDI[1]);
        pVar5 = andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>::findEdge
                          (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                           (size_t)in_stack_ffffffffffffff40._M_cur);
        if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI[1] + 0x20),
                              pVar5.second);
          local_30 = local_30 - *pvVar2;
        }
        std::__detail::_Node_iterator<unsigned_long,_true,_false>::operator++
                  (in_stack_fffffffffffffed0);
      }
      std::__detail::_Node_iterator<unsigned_long,_true,_false>::operator++
                (in_stack_fffffffffffffed0);
    }
    in_RDI[0x19] = (unsigned_long)(local_30 + (double)in_RDI[0x19]);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1dcd22);
    __lhs = (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             *)std::
               unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
               ::size((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                       *)0x1dcd2f);
    p_Var3 = (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              *)std::
                unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                ::size((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                        *)0x1dcd41);
    if (__lhs < p_Var3) {
      partitionId = local_88;
      std::
      unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
      ::size((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
              *)0x1dcd6f);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 in_stack_ffffffffffffff00._M_current,in_stack_fffffffffffffef8);
      std::
      unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
      ::begin(in_stack_fffffffffffffec8);
      local_c8._M_cur =
           (__node_type *)
           std::
           unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
           ::end(in_stack_fffffffffffffec8);
      while (bVar1 = std::__detail::operator!=
                               ((_Node_iterator_base<unsigned_long,_false> *)
                                &stack0xffffffffffffff40,&local_c8), this_00 = in_RSI, bVar1) {
        std::__detail::_Node_iterator<unsigned_long,_true,_false>::operator*
                  ((_Node_iterator<unsigned_long,_true,_false> *)0x1dcdd4);
        std::vector<unsigned_long,std::allocator<unsigned_long>>::emplace_back<unsigned_long_const&>
                  (in_stack_fffffffffffffee0,in_RDI);
        std::__detail::_Node_iterator<unsigned_long,_true,_false>::operator++
                  ((_Node_iterator<unsigned_long,_true,_false> *)__lhs);
      }
    }
    else {
      this_00 = in_RSI;
      std::
      unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
      ::size((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
              *)0x1dce43);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 in_stack_ffffffffffffff00._M_current,in_stack_fffffffffffffef8);
      in_stack_ffffffffffffff20._M_cur =
           (__node_type *)
           std::
           unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
           ::begin(in_stack_fffffffffffffec8);
      in_stack_ffffffffffffff18._M_cur =
           (__node_type *)
           std::
           unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
           ::end(in_stack_fffffffffffffec8);
      partitionId = local_88;
      while (bVar1 = std::__detail::operator!=
                               ((_Node_iterator_base<unsigned_long,_false> *)
                                &stack0xffffffffffffff20,
                                (_Node_iterator_base<unsigned_long,_false> *)
                                &stack0xffffffffffffff18), local_88 = in_RSI, bVar1) {
        in_stack_ffffffffffffff10 =
             std::__detail::_Node_iterator<unsigned_long,_true,_false>::operator*
                       ((_Node_iterator<unsigned_long,_true,_false> *)0x1dce9f);
        std::vector<unsigned_long,std::allocator<unsigned_long>>::emplace_back<unsigned_long_const&>
                  (in_stack_fffffffffffffee0,in_RDI);
        std::__detail::_Node_iterator<unsigned_long,_true,_false>::operator++
                  ((_Node_iterator<unsigned_long,_true,_false> *)__lhs);
      }
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffec8);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffec8);
    while (bVar1 = __gnu_cxx::operator!=
                             (__lhs,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                     *)in_stack_fffffffffffffec8), bVar1) {
      __gnu_cxx::
      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator*((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                   *)&stack0xffffffffffffff00);
      PartitionGraph::forceMove
                ((PartitionGraph *)in_stack_ffffffffffffff20._M_cur,
                 (size_t)in_stack_ffffffffffffff18._M_cur,(size_t)in_stack_ffffffffffffff10);
      __gnu_cxx::
      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    *)&stack0xffffffffffffff00);
    }
    PartitionGraph::updateEdgesOfPartition(this_00,(size_t)partitionId);
    PartitionGraph::updateEdgesOfPartition(this_00,(size_t)partitionId);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(in_stack_fffffffffffffee0);
    dVar4 = (double)(**(code **)(*in_RDI + 0x18))(in_RDI,local_88,local_88);
    in_RDI[0x1a] = (unsigned_long)((dVar4 - (double)in_RDI[0x1c]) + (double)in_RDI[0x1a]);
  }
  return;
}

Assistant:

inline void
PartitionOptimizerBase<BROPT>::applyMerge(size_t partitionIdA,
                                          size_t partitionIdB)
{
    auto& partitionA = partitionGraph_.partitions_[partitionIdA];
    auto& partitionB = partitionGraph_.partitions_[partitionIdB];

    if (partitionA.empty() || partitionB.empty()) {
        return;
    }

    // calculate gain (in-frame) of merging.
    Cost dObj = .0;
    for (const auto& v : partitionA) {
        for (const auto& w : partitionB) {
            const auto p = this->data_.problemGraph.graph().findEdge(v, w);
            if (p.first) {
                dObj -= this->data_.costs[p.second];
            }
        }
    }
    internalObjective_ += dObj;

    // merge & update partitionGraph
    size_t otherId;
    {
        std::vector<size_t> buffer;
        if (partitionA.size() < partitionB.size()) {
            otherId = partitionIdB;

            buffer.reserve(partitionA.size());
            for (const auto& v : partitionA) {
                buffer.emplace_back(v);
            }
        } else {
            otherId = partitionIdA;

            buffer.reserve(partitionB.size());
            for (const auto& v : partitionB) {
                buffer.emplace_back(v);
            }
        }

        for (const auto& v : buffer) {
            partitionGraph_.forceMove(v, otherId);
        }

        partitionGraph_.updateEdgesOfPartition(partitionIdA);
        partitionGraph_.updateEdgesOfPartition(partitionIdB);
    }

    // calculate new branching.
    const auto localBranchingObj = solveLocalBranchingProblem(otherId, otherId);
    const auto dLocalBranchingObj =
        (localBranchingObj - localBranchingObjective_);

    branchingObjective_ += dLocalBranchingObj;
}